

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserNumber.cpp
# Opt level: O3

bool __thiscall
Rml::PropertyParserNumber::ParseValue
          (PropertyParserNumber *this,Property *property,String *value,ParameterMap *param_3)

{
  byte bVar1;
  Unit UVar2;
  code *pcVar3;
  Table<true,80ul,std::__cxx11::string,Rml::Unit,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  *pTVar4;
  bool bVar5;
  size_t sVar6;
  size_type sVar7;
  size_type sVar8;
  long lVar9;
  float value_00;
  String str_number;
  String str_unit;
  char *str_end;
  long *local_c0 [2];
  long local_b0 [2];
  String local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  long *local_60;
  Variant local_58;
  
  sVar7 = value->_M_string_length;
  do {
    sVar8 = sVar7 - 1;
    if ((sVar7 == 0) || (bVar1 = (value->_M_dataplus)._M_p[sVar7 - 1], (byte)(bVar1 - 0x30) < 10))
    break;
    sVar7 = sVar8;
  } while ((0x20 < bVar1) || ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0));
  ::std::__cxx11::string::substr((ulong)local_c0,(ulong)value);
  ::std::__cxx11::string::substr((ulong)&local_a0,(ulong)value);
  StringUtilities::ToLower(&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_60 = (long *)0x0;
  value_00 = strtof((char *)local_c0[0],(char **)&local_60);
  if (local_c0[0] == local_60) goto LAB_00258060;
  if ((DAT_0033b808 ==
       (Table<true,80ul,std::__cxx11::string,Rml::Unit,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
        *)0x0) &&
     (bVar5 = Assert("Resource used before it was initialized, or after it was shut down.",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                     ,0x46), !bVar5)) {
LAB_002580ac:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  pTVar4 = DAT_0033b808;
  sVar6 = robin_hood::detail::
          Table<true,80ul,std::__cxx11::string,Rml::Unit,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          ::findIdx<std::__cxx11::string>(DAT_0033b808,&local_80);
  lVar9 = sVar6 * 0x28 + *(long *)pTVar4;
  if ((DAT_0033b808 ==
       (Table<true,80ul,std::__cxx11::string,Rml::Unit,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
        *)0x0) &&
     (bVar5 = Assert("Resource used before it was initialized, or after it was shut down.",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                     ,0x46), !bVar5)) goto LAB_002580ac;
  if (lVar9 == *(long *)(DAT_0033b808 + 8)) {
LAB_00258060:
    bVar5 = false;
  }
  else {
    UVar2 = *(Unit *)(lVar9 + 0x20);
    if ((this->units & UVar2) == UNKNOWN) {
      if (UVar2 != NUMBER) goto LAB_00258060;
      bVar5 = false;
      if (((this->zero_unit == UNKNOWN) || (bVar5 = false, value_00 != 0.0)) || (NAN(value_00)))
      goto LAB_00258062;
      property->unit = this->zero_unit;
      local_58.type = NONE;
      Variant::Set(&local_58,0.0);
      Variant::operator=(&property->value,&local_58);
      Variant::~Variant(&local_58);
    }
    else {
      Variant::Clear(&property->value);
      Variant::Set(&property->value,value_00);
      property->unit = UVar2;
    }
    bVar5 = true;
  }
LAB_00258062:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0],local_b0[0] + 1);
  }
  return bVar5;
}

Assistant:

bool PropertyParserNumber::ParseValue(Property& property, const String& value, const ParameterMap& /*parameters*/) const
{
	// Find the beginning of the unit string in 'value'.
	size_t unit_pos = 0;
	for (size_t i = value.size(); i--;)
	{
		const char c = value[i];
		if ((c >= '0' && c <= '9') || StringUtilities::IsWhitespace(c))
		{
			unit_pos = i + 1;
			break;
		}
	}

	String str_number = value.substr(0, unit_pos);
	String str_unit = StringUtilities::ToLower(value.substr(unit_pos));

	char* str_end = nullptr;
	float float_value = strtof(str_number.c_str(), &str_end);
	if (str_number.c_str() == str_end)
	{
		// Number conversion failed
		return false;
	}

	const auto it = parser_data->unit_string_map.find(str_unit);
	if (it == parser_data->unit_string_map.end())
	{
		// Invalid unit name
		return false;
	}

	const Unit unit = it->second;

	if (Any(unit & units))
	{
		property.value = float_value;
		property.unit = unit;
		return true;
	}

	// Detected unit not allowed.
	// However, we allow a value of "0" if zero_unit is set and no unit specified (that is, unit is a pure NUMBER).
	if (unit == Unit::NUMBER)
	{
		if (zero_unit != Unit::UNKNOWN && float_value == 0.0f)
		{
			property.unit = zero_unit;
			property.value = Variant(0.0f);
			return true;
		}
	}

	return false;
}